

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::drawHardwareBuffer(COpenGLDriver *this,SHWBufferLink *_HWBuffer)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GLuint buffer;
  undefined4 uVar5;
  long in_RSI;
  long *in_RDI;
  void *indexList;
  void *vertices;
  IMeshBuffer *mb;
  SHWBufferLink_opengl *HWBuffer;
  GLuint in_stack_ffffffffffffff88;
  GLenum in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 local_30;
  undefined8 local_28;
  
  if (in_RSI != 0) {
    (**(code **)(*in_RDI + 0x358))(in_RDI,in_RSI);
    plVar1 = *(long **)(in_RSI + 8);
    local_28 = (**(code **)(*plVar1 + 0x18))();
    local_30 = (**(code **)(*plVar1 + 0x38))();
    if (*(int *)(in_RSI + 0x18) != 0) {
      COpenGLExtensionHandler::extGlBindBuffer
                ((COpenGLExtensionHandler *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_28 = 0;
    }
    if (*(int *)(in_RSI + 0x1c) != 0) {
      COpenGLExtensionHandler::extGlBindBuffer
                ((COpenGLExtensionHandler *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_30 = 0;
    }
    uVar2 = (**(code **)(*plVar1 + 0x28))();
    uVar3 = (**(code **)(*plVar1 + 0xf0))();
    uVar4 = (**(code **)(*plVar1 + 0x10))();
    buffer = (**(code **)(*plVar1 + 0xe8))();
    uVar5 = (**(code **)(*plVar1 + 0x30))();
    (**(code **)(*in_RDI + 0x158))(in_RDI,local_28,uVar2,local_30,uVar3,uVar4);
    if (*(int *)(in_RSI + 0x18) != 0) {
      COpenGLExtensionHandler::extGlBindBuffer
                ((COpenGLExtensionHandler *)CONCAT44(in_stack_ffffffffffffff94,uVar5),
                 in_stack_ffffffffffffff8c,buffer);
    }
    if (*(int *)(in_RSI + 0x1c) != 0) {
      COpenGLExtensionHandler::extGlBindBuffer
                ((COpenGLExtensionHandler *)CONCAT44(in_stack_ffffffffffffff94,uVar5),
                 in_stack_ffffffffffffff8c,buffer);
    }
  }
  return;
}

Assistant:

void COpenGLDriver::drawHardwareBuffer(SHWBufferLink *_HWBuffer)
{
	if (!_HWBuffer)
		return;

	updateHardwareBuffer(_HWBuffer); // check if update is needed

#if defined(GL_ARB_vertex_buffer_object)
	SHWBufferLink_opengl *HWBuffer = (SHWBufferLink_opengl *)_HWBuffer;

	const scene::IMeshBuffer *mb = HWBuffer->MeshBuffer;
	const void *vertices = mb->getVertices();
	const void *indexList = mb->getIndices();

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER) {
		extGlBindBuffer(GL_ARRAY_BUFFER, HWBuffer->vbo_verticesID);
		vertices = 0;
	}

	if (HWBuffer->Mapped_Index != scene::EHM_NEVER) {
		extGlBindBuffer(GL_ELEMENT_ARRAY_BUFFER, HWBuffer->vbo_indicesID);
		indexList = 0;
	}

	drawVertexPrimitiveList(vertices, mb->getVertexCount(), indexList, mb->getPrimitiveCount(), mb->getVertexType(), mb->getPrimitiveType(), mb->getIndexType());

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER)
		extGlBindBuffer(GL_ARRAY_BUFFER, 0);
	if (HWBuffer->Mapped_Index != scene::EHM_NEVER)
		extGlBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
#endif
}